

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztriangle.cpp
# Opt level: O2

void pztopology::TPZTriangle::ComputeHCurlDirections<Fad<double>>
               (TPZFMatrix<Fad<double>_> *gradx,TPZFMatrix<Fad<double>_> *directions,
               TPZVec<int> *transformationIds)

{
  int iVar1;
  int64_t size;
  int *piVar2;
  Fad<double> *pFVar3;
  long lVar4;
  long lVar5;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> local_1e8;
  Fad<double> *local_1d0;
  Fad<double> *local_1c8;
  undefined1 local_1c0 [8];
  Vector<double> local_1b8;
  Fad<double> *local_1a8;
  undefined1 local_1a0 [8];
  Vector<double> local_198;
  REAL *local_188;
  double local_180;
  long local_178;
  TPZManVector<double,_3> edgeSign;
  undefined1 local_138 [8];
  TPZManVector<Fad<double>,_3> v2;
  TPZManVector<Fad<double>,_3> v1;
  
  size = (gradx->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  TPZManVector<Fad<double>,_3>::TPZManVector(&v1,size);
  TPZManVector<Fad<double>,_3>::TPZManVector(&v2,size);
  lVar5 = 0;
  local_178 = size;
  if (size < 1) {
    local_178 = lVar5;
  }
  for (lVar4 = 0; local_178 != lVar4; lVar4 = lVar4 + 1) {
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(gradx,lVar4,0);
    Fad<double>::operator=
              ((Fad<double> *)((long)&(v1.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar5),pFVar3);
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(gradx,lVar4,1);
    Fad<double>::operator=
              ((Fad<double> *)((long)&(v2.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar5),pFVar3);
    lVar5 = lVar5 + 0x20;
  }
  iVar1 = transformationIds->fStore[3];
  local_1c0 = (undefined1  [8])0x0;
  TPZManVector<double,_3>::TPZManVector(&edgeSign,3,(double *)local_1c0);
  piVar2 = transformationIds->fStore;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    edgeSign.super_TPZVec<double>.fStore[lVar5] = (double)(int)(-(uint)(piVar2[lVar5] != 0) | 1);
  }
  local_180 = (double)(int)(-(*(byte *)(piVar2 + 3) & 1) | 1);
  local_188 = fTangentVectors[iVar1 * 2];
  lVar4 = 0;
  for (lVar5 = 0; local_178 != lVar5; lVar5 = lVar5 + 1) {
    local_1e8.fadexpr_.left_ =
         (Fad<double> *)((long)&(v1.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_1e8.fadexpr_.right_.constant_ = *edgeSign.super_TPZVec<double>.fStore;
    local_1e8.fadexpr_.right_.defaultVal = 0.0;
    local_1b8.num_elts = 0;
    local_1b8._4_4_ = 0x3ff00000;
    local_1b8.ptr_to_data = (double *)0x0;
    local_1c0 = (undefined1  [8])&local_1e8;
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar5,0);
    Fad<double>::operator=
              (pFVar3,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>
                       *)local_1c0);
    local_1a0 = (undefined1  [8])((long)&(v1.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_198._0_8_ = (long)&(v2.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4;
    local_1e8.fadexpr_.right_.constant_ = *edgeSign.super_TPZVec<double>.fStore;
    local_1e8.fadexpr_.right_.defaultVal = 0.0;
    local_1b8.num_elts = 0;
    local_1b8._4_4_ = 0x3ff00000;
    local_1b8.ptr_to_data = (double *)0x0;
    local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
    local_1c0 = (undefined1  [8])&local_1e8;
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar5,1);
    Fad<double>::operator=
              (pFVar3,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                       *)local_1c0);
    local_1a0 = (undefined1  [8])((long)&(v2.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_198.num_elts = 0x667f3bcd;
    local_198._4_4_ = 0x3ff6a09e;
    local_198.ptr_to_data = (double *)0x0;
    local_1e8.fadexpr_.right_.constant_ = edgeSign.super_TPZVec<double>.fStore[1];
    local_1e8.fadexpr_.right_.defaultVal = 0.0;
    local_1b8.num_elts = 0x667f3bcd;
    local_1b8._4_4_ = 0x3ff6a09e;
    local_1b8.ptr_to_data = (double *)0x0;
    local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
    local_1c0 = (undefined1  [8])&local_1e8;
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar5,2);
    Fad<double>::operator=
              (pFVar3,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                       *)local_1c0);
    local_1d0 = (Fad<double> *)((long)&(v1.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_1a0 = (undefined1  [8])&local_1d0;
    local_198.num_elts = 0x667f3bcd;
    local_198._4_4_ = 0x3ff6a09e;
    local_198.ptr_to_data = (double *)0x0;
    local_1e8.fadexpr_.right_.constant_ = edgeSign.super_TPZVec<double>.fStore[1];
    local_1e8.fadexpr_.right_.defaultVal = 0.0;
    local_1b8.num_elts = 0x667f3bcd;
    local_1b8._4_4_ = 0x3ff6a09e;
    local_1b8.ptr_to_data = (double *)0x0;
    local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
    local_1c0 = (undefined1  [8])&local_1e8;
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar5,3);
    Fad<double>::operator=
              (pFVar3,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                       *)local_1c0);
    local_1d0 = (Fad<double> *)((long)&(v1.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_1c8 = (Fad<double> *)((long)&(v2.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_1a0 = (undefined1  [8])&local_1d0;
    local_198.num_elts = -1;
    local_198._4_4_ = 0;
    local_1e8.fadexpr_.right_.constant_ = edgeSign.super_TPZVec<double>.fStore[2];
    local_1e8.fadexpr_.right_.defaultVal = 0.0;
    local_1b8.num_elts = 0;
    local_1b8._4_4_ = 0x3ff00000;
    local_1b8.ptr_to_data = (double *)0x0;
    local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
    local_1c0 = (undefined1  [8])&local_1e8;
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar5,4);
    Fad<double>::operator=
              (pFVar3,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                       *)local_1c0);
    local_1a0 = (undefined1  [8])((long)&(v2.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_1e8.fadexpr_.right_.constant_ = edgeSign.super_TPZVec<double>.fStore[2];
    local_1e8.fadexpr_.right_.defaultVal = 0.0;
    local_1b8.num_elts = 0;
    local_1b8._4_4_ = 0x3ff00000;
    local_1b8.ptr_to_data = (double *)0x0;
    local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
    local_1c0 = (undefined1  [8])&local_1e8;
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar5,5);
    Fad<double>::operator=
              (pFVar3,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                       *)local_1c0);
    local_1d0 = (Fad<double> *)((long)&(v1.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_1a8 = (Fad<double> *)((long)&(v2.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_1b8.num_elts = 0;
    local_1b8._4_4_ = 0x3fe00000;
    local_1b8.ptr_to_data = (double *)0x0;
    local_198._0_8_ = *edgeSign.super_TPZVec<double>.fStore;
    local_1a0 = (undefined1  [8])&local_1d0;
    local_198.ptr_to_data = (double *)0x0;
    local_1e8.fadexpr_.right_.constant_ = 1.0;
    local_1e8.fadexpr_.right_.defaultVal = 0.0;
    local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
    local_1c8 = (Fad<double> *)local_1c0;
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar5,6);
    Fad<double>::operator=
              (pFVar3,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                       *)&local_1e8);
    local_138 = (undefined1  [8])((long)&(v1.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_1c8 = (Fad<double> *)((long)&(v2.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_1d0 = (Fad<double> *)local_138;
    local_1a0 = (undefined1  [8])&local_1d0;
    local_198.num_elts = 0x667f3bcd;
    local_198._4_4_ = 0x3fe6a09e;
    local_198.ptr_to_data = (double *)0x0;
    local_1e8.fadexpr_.right_.constant_ = edgeSign.super_TPZVec<double>.fStore[1];
    local_1e8.fadexpr_.right_.defaultVal = 0.0;
    local_1b8.num_elts = 0x667f3bcd;
    local_1b8._4_4_ = 0x3ff6a09e;
    local_1b8.ptr_to_data = (double *)0x0;
    local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
    local_1c0 = (undefined1  [8])&local_1e8;
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar5,7);
    Fad<double>::operator=
              (pFVar3,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                       *)local_1c0);
    local_1a8 = (Fad<double> *)((long)&(v1.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_1b8.num_elts = 0;
    local_1b8._4_4_ = 0xbfe00000;
    local_1b8.ptr_to_data = (double *)0x0;
    local_1c8 = (Fad<double> *)((long)&(v2.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_198._0_8_ = edgeSign.super_TPZVec<double>.fStore[2];
    local_1a0 = (undefined1  [8])&local_1d0;
    local_198.ptr_to_data = (double *)0x0;
    local_1e8.fadexpr_.right_.constant_ = 1.0;
    local_1e8.fadexpr_.right_.defaultVal = 0.0;
    local_1e8.fadexpr_.left_ = (Fad<double> *)local_1a0;
    local_1d0 = (Fad<double> *)local_1c0;
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar5,8);
    Fad<double>::operator=
              (pFVar3,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                       *)&local_1e8);
    local_1b8._0_8_ = *edgeSign.super_TPZVec<double>.fStore * local_180;
    local_1b8.ptr_to_data = (double *)0x0;
    local_1a8 = (Fad<double> *)((long)&(v2.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_1e8.fadexpr_.right_.constant_ = 0.5;
    local_1e8.fadexpr_.right_.defaultVal = 0.0;
    local_1e8.fadexpr_.left_ = (Fad<double> *)local_1c0;
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar5,9);
    Fad<double>::operator=
              (pFVar3,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)&local_1e8);
    local_1b8._0_8_ = edgeSign.super_TPZVec<double>.fStore[1] * local_180;
    local_1d0 = (Fad<double> *)((long)&(v2.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_198._0_8_ = (long)&(v1.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4;
    local_1a0 = (undefined1  [8])&local_1d0;
    local_1b8.ptr_to_data = (double *)0x0;
    local_1e8.fadexpr_.right_.constant_ = 0.5;
    local_1e8.fadexpr_.right_.defaultVal = 0.0;
    local_1e8.fadexpr_.left_ = (Fad<double> *)local_1c0;
    local_1a8 = (Fad<double> *)local_1a0;
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar5,10);
    Fad<double>::operator=
              (pFVar3,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                       *)&local_1e8);
    local_1b8._0_8_ = edgeSign.super_TPZVec<double>.fStore[2] * local_180;
    local_1b8.ptr_to_data = (double *)0x0;
    local_1a8 = (Fad<double> *)((long)&(v1.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    local_1e8.fadexpr_.right_.constant_ = 0.5;
    local_1e8.fadexpr_.right_.defaultVal = 0.0;
    local_1e8.fadexpr_.left_ = (Fad<double> *)local_1c0;
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar5,0xb);
    Fad<double>::operator=
              (pFVar3,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)&local_1e8);
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar5,0xc);
    Fad<double>::operator=<double,_nullptr>(pFVar3,local_188);
    pFVar3 = TPZFMatrix<Fad<double>_>::operator()(directions,lVar5,0xd);
    Fad<double>::operator=<double,_nullptr>(pFVar3,(double *)(local_188 + 2));
    local_188 = local_188 + 1;
    lVar4 = lVar4 + 0x20;
  }
  TPZManVector<double,_3>::~TPZManVector(&edgeSign);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&v2);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&v1);
  return;
}

Assistant:

void TPZTriangle::ComputeHCurlDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions, const TPZVec<int> &transformationIds)
    {
        const auto dim = gradx.Rows();
        TPZManVector<TVar, 3> v1(dim),v2(dim);
        for (int i=0; i<dim; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
        }
        constexpr auto nEdges{3}, nFaces{1};
        constexpr REAL faceArea{TPZTriangle::RefElVolume()};
        constexpr REAL edgeLength[nEdges]{1,M_SQRT2,1};
        const int facePermute = transformationIds[nEdges];
        TPZManVector<REAL,nEdges> edgeSign(nEdges,0);
        for(auto iEdge = 0; iEdge < nEdges; iEdge++){
            edgeSign[iEdge] = transformationIds[iEdge] == 0 ? 1 : -1;
        }
        const int faceOrient =  transformationIds[nEdges] % 2 == 0 ? 1 : -1;

        for (int i=0; i<dim; i++)
        {
            //v^{e,a} constant vector fields associated with edge e and vertex a
            //they are defined in such a way that v^{e,a} is normal to the edge \hat{e}
            //adjacent to edge e by the vertex a. the tangential component is set to be 1 /edgeLength[e]
            directions(i,0) = (v1[i]) * edgeSign[0] / edgeLength[0];
            directions(i,1) = (v1[i]+v2[i]) * edgeSign[0] / edgeLength[0];
            directions(i,2) = (v2[i]*M_SQRT2) * edgeSign[1] / edgeLength[1];
            directions(i,3) = (-v1[i]*M_SQRT2) * edgeSign[1] / edgeLength[1];
            directions(i,4) = (v1[i] + v2[i]) * -1 * edgeSign[2] / edgeLength[2];
            directions(i,5) = (-v2[i]) * edgeSign[2] / edgeLength[2];

            //v^{e,T} constant vector fields associated with edge e and aligned with it
            directions(i,6) = (v1[i]+0.5*v2[i]) * edgeSign[0] / edgeLength[0];
            directions(i,7) = ((-v1[i]+v2[i]) * M_SQRT1_2) * edgeSign[1] / edgeLength[1];
            directions(i,8) = (-0.5*v1[i]-v2[i]) * edgeSign[2] / edgeLength[2];

            //v^{F,e} constant vector fields associated with face F and edge e
            //they are defined in such a way that v^{F,e} is normal to the face \hat{F}
            //adjacent to face F by edge e
            directions(i,9)  = faceOrient * edgeSign[0] *  v2[i] /faceArea;//* edgeLength[0];
            directions(i,10) = faceOrient * edgeSign[1] *  (-v2[i]-v1[i]) /faceArea;//* edgeLength[1];
            directions(i,11) = faceOrient * edgeSign[2] *  v1[i] /faceArea;//* edgeLength[0];

            //v^{F,T} orthonormal vectors associated with face F and tangent to it.
            directions(i,12) = fTangentVectors[2*facePermute][i];
            directions(i,13) = fTangentVectors[2*facePermute + 1][i];
        }
    }